

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_DataBlob_impl.hpp
# Opt level: O3

DataBlob * __thiscall hrgls::datablob::DataBlob::operator=(DataBlob *this,DataBlob *copy)

{
  hrgls_Status hVar1;
  DataBlob_private *returnBlob;
  hrgls_DataBlob blobToCopy;
  DataBlob_private *pDVar2;
  
  pDVar2 = this->m_private;
  if (pDVar2 != (DataBlob_private *)0x0) {
    if (pDVar2->blob != (hrgls_DataBlob)0x0) {
      operator_delete(pDVar2->blob);
      pDVar2 = this->m_private;
    }
    operator_delete(pDVar2);
  }
  returnBlob = (DataBlob_private *)operator_new(0x10);
  returnBlob->blob = (hrgls_DataBlob)0x0;
  *(undefined8 *)&returnBlob->status = 0;
  this->m_private = returnBlob;
  pDVar2 = copy->m_private;
  blobToCopy = (hrgls_DataBlob)0x0;
  if (pDVar2 != (DataBlob_private *)0x0) {
    blobToCopy = pDVar2->blob;
    hVar1 = 0;
    if (blobToCopy == (hrgls_DataBlob)0x0) {
      hVar1 = 0x3ee;
    }
    pDVar2->status = hVar1;
  }
  hVar1 = hrgls_DataBlobCopy((hrgls_DataBlob *)returnBlob,blobToCopy);
  this->m_private->status = hVar1;
  return this;
}

Assistant:

DataBlob& DataBlob::operator = (const DataBlob&copy)
    {
      // Get rid of any pre-existing data that we have.
      if (m_private) {
        if (m_private->blob) {
          hrgls_DataBlobDestroy(m_private->blob);
        }
        delete m_private;
      }

      m_private = new DataBlob_private();
      m_private->status = hrgls_DataBlobCopy(&m_private->blob, copy.RawDataBlob());
      return *this;
    }